

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O3

bool __thiscall
Diligent::FramebufferCache::FramebufferCacheKey::UsesImageView
          (FramebufferCacheKey *this,VkImageView View)

{
  ulong uVar1;
  
  if ((ulong)this->NumRenderTargets != 0) {
    uVar1 = 0;
    do {
      if (this->RTVs[uVar1] == View) {
        return true;
      }
      uVar1 = uVar1 + 1;
    } while (this->NumRenderTargets != uVar1);
  }
  return this->ShadingRate == View || this->DSV == View;
}

Assistant:

bool FramebufferCache::FramebufferCacheKey::UsesImageView(VkImageView View) const
{
    for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
    {
        if (RTVs[rt] == View)
            return true;
    }
    return DSV == View || ShadingRate == View;
}